

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_loader.c
# Opt level: O0

_Bool read_rom(char *rom_filename)

{
  int iVar1;
  FILE *__stream;
  size_t __size;
  uint8_t *rom_data_00;
  size_t sVar2;
  size_t bytes_read;
  uint8_t *rom_data;
  long rom_size_in_bytes;
  FILE *rom_filehandle;
  char *rom_filename_local;
  
  __stream = (FILE *)open_rom_file(rom_filename);
  if (__stream == (FILE *)0x0) {
    rom_filename_local._7_1_ = true;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      __size = ftell(__stream);
      if (__size == 0xffffffffffffffff) {
        printf("ERROR: ftell failed to get the size of the rom image\n");
        rom_filename_local._7_1_ = true;
      }
      else {
        iVar1 = fseek(__stream,0,0);
        if (iVar1 == 0) {
          rom_data_00 = (uint8_t *)malloc(__size);
          if (rom_data_00 == (uint8_t *)0x0) {
            printf("ERROR: Failed to malloc memory block for rom data\n");
            rom_filename_local._7_1_ = true;
          }
          else {
            sVar2 = fread(rom_data_00,1,__size,__stream);
            fclose(__stream);
            if (sVar2 == __size) {
              parse_iNes_1_0_header(rom_data_00);
              parse_PRG_rom(rom_data_00);
              parse_CHR_rom(rom_data_00);
              free(rom_data_00);
              rom_filename_local._7_1_ = false;
            }
            else {
              printf("ERROR: Only read %u bytes when expecting %u bytes.\n",sVar2 & 0xffffffff,
                     __size & 0xffffffff);
              rom_filename_local._7_1_ = true;
            }
          }
        }
        else {
          printf("ERROR: Failed to move to START of file\n");
          rom_filename_local._7_1_ = true;
        }
      }
    }
    else {
      printf("ERROR: Failed to move to END of file\n");
      rom_filename_local._7_1_ = true;
    }
  }
  return rom_filename_local._7_1_;
}

Assistant:

static bool read_rom(const char* rom_filename) {
    FILE* rom_filehandle = open_rom_file(rom_filename);
    if(rom_filehandle == NULL) {
        return true;
    }

    if(fseek(rom_filehandle, 0, SEEK_END) != 0) {
        printf("ERROR: Failed to move to END of file\n");
        return true;
    }

    long rom_size_in_bytes = ftell(rom_filehandle);
    if(rom_size_in_bytes == -1L) {
        printf("ERROR: ftell failed to get the size of the rom image\n");
        return true;
    }

    if(fseek(rom_filehandle, 0, SEEK_SET) != 0) {
        printf("ERROR: Failed to move to START of file\n");
        return true;
    }

    uint8_t* rom_data = malloc(rom_size_in_bytes * sizeof(uint8_t));
    if(rom_data == NULL) {
        printf("ERROR: Failed to malloc memory block for rom data\n");
        return true;
    }
    size_t bytes_read = fread(rom_data, sizeof(uint8_t), rom_size_in_bytes, rom_filehandle);
    fclose(rom_filehandle);

    if(bytes_read != rom_size_in_bytes) {
        printf("ERROR: Only read %u bytes when expecting %u bytes.\n",
               (uint32_t)bytes_read, (uint32_t)rom_size_in_bytes);
        return true;
    }

    parse_iNes_1_0_header(rom_data);
    parse_PRG_rom(rom_data);
    parse_CHR_rom(rom_data);
    free(rom_data);

    return false;
}